

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O1

Aig_Obj_t * Aig_NodeBddToMuxes_rec(DdManager *dd,DdNode *bFunc,Aig_Man_t *pNew,st__table *tBdd2Node)

{
  undefined8 uVar1;
  int iVar2;
  Aig_Obj_t *p1;
  DdNode *key;
  Aig_Obj_t *pNode;
  Aig_Obj_t *pNodeC;
  Aig_Obj_t *local_48;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  if (((ulong)bFunc & 1) != 0) {
    __assert_fail("!Cudd_IsComplement(bFunc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigSplit.c"
                  ,0x37,
                  "Aig_Obj_t *Aig_NodeBddToMuxes_rec(DdManager *, DdNode *, Aig_Man_t *, st__table *)"
                 );
  }
  iVar2 = st__lookup(tBdd2Node,(char *)bFunc,(char **)&local_48);
  if (iVar2 == 0) {
    local_40 = Aig_NodeBddToMuxes_rec
                         (dd,(DdNode *)((ulong)(bFunc->type).kids.E & 0xfffffffffffffffe),pNew,
                          tBdd2Node);
    uVar1 = *(undefined8 *)((long)&bFunc->type + 8);
    p1 = Aig_NodeBddToMuxes_rec(dd,(bFunc->type).kids.T,pNew,tBdd2Node);
    key = Cudd_bddIthVar(dd,bFunc->index);
    iVar2 = st__lookup(tBdd2Node,(char *)key,(char **)&local_38);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigSplit.c"
                    ,0x3f,
                    "Aig_Obj_t *Aig_NodeBddToMuxes_rec(DdManager *, DdNode *, Aig_Man_t *, st__table *)"
                   );
    }
    local_48 = Aig_Mux(pNew,local_38,p1,(Aig_Obj_t *)((ulong)((uint)uVar1 & 1) ^ (ulong)local_40));
    st__insert(tBdd2Node,(char *)bFunc,(char *)local_48);
  }
  return local_48;
}

Assistant:

Aig_Obj_t * Aig_NodeBddToMuxes_rec( DdManager * dd, DdNode * bFunc, Aig_Man_t * pNew, st__table * tBdd2Node )
{
    Aig_Obj_t * pNode, * pNode0, * pNode1, * pNodeC;
    assert( !Cudd_IsComplement(bFunc) );
    if ( st__lookup( tBdd2Node, (char *)bFunc, (char **)&pNode ) )
        return pNode;
    // solve for the children nodes
    pNode0 = Aig_NodeBddToMuxes_rec( dd, Cudd_Regular(cuddE(bFunc)), pNew, tBdd2Node );
    pNode0 = Aig_NotCond( pNode0, Cudd_IsComplement(cuddE(bFunc)) );
    pNode1 = Aig_NodeBddToMuxes_rec( dd, cuddT(bFunc), pNew, tBdd2Node );
    if ( ! st__lookup( tBdd2Node, (char *)Cudd_bddIthVar(dd, bFunc->index), (char **)&pNodeC ) )
        assert( 0 );
    // create the MUX node
    pNode = Aig_Mux( pNew, pNodeC, pNode1, pNode0 );
    st__insert( tBdd2Node, (char *)bFunc, (char *)pNode );
    return pNode;
}